

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O1

int ON_StringLengthUTF32(ON__UINT32 *string)

{
  ON__UINT32 OVar1;
  ON__UINT32 *pOVar2;
  ON__UINT32 *pOVar3;
  ON__UINT32 *string1;
  
  if (string == (ON__UINT32 *)0x0) {
    pOVar2 = (ON__UINT32 *)0x0;
  }
  else {
    pOVar2 = string + -1;
    pOVar3 = string;
    do {
      pOVar2 = pOVar2 + 1;
      OVar1 = *pOVar3;
      pOVar3 = pOVar3 + 1;
    } while (OVar1 != 0);
  }
  return (int)((ulong)((long)pOVar2 - (long)string) >> 2);
}

Assistant:

int ON_StringLengthUTF32(
  const ON__UINT32* string
  )
{
  const ON__UINT32* string1 = string;
  if (nullptr != string1)
  {
    while (0 != *string1)
      string1++;
  }
  return (int)(string1 - string);
}